

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O3

iter * __thiscall riffcpp::Chunk::iterator::operator++(iterator *this)

{
  streampos *psVar1;
  impl *piVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __mbstate_t _Var5;
  undefined4 uVar6;
  int iVar7;
  anon_union_4_2_91654ee9_for___value aVar8;
  impl *piVar9;
  undefined4 *puVar10;
  long lVar11;
  Chunk chunk;
  Chunk local_30;
  
  piVar9 = (impl *)operator_new(0x48);
  (piVar9->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar9->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar9->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar9->m_pos)._M_off = 0;
  (piVar9->m_pos)._M_state.__count = 0;
  (piVar9->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar9->m_limit)._M_off = 0;
  (piVar9->m_limit)._M_state.__count = 0;
  (piVar9->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  piVar9->m_id = (_Type)0x0;
  piVar9->m_size = 0;
  piVar2 = this->pimpl;
  (piVar9->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (piVar2->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar9->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(piVar2->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  piVar2 = this->pimpl;
  uVar6 = *(undefined4 *)((long)&(piVar2->m_pos)._M_off + 4);
  iVar7 = (piVar2->m_pos)._M_state.__count;
  aVar8 = (piVar2->m_pos)._M_state.__value;
  *(int *)&(piVar9->m_pos)._M_off = (int)(piVar2->m_pos)._M_off;
  *(undefined4 *)((long)&(piVar9->m_pos)._M_off + 4) = uVar6;
  (piVar9->m_pos)._M_state.__count = iVar7;
  (piVar9->m_pos)._M_state.__value = aVar8;
  peVar3 = (piVar9->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var4 = (piVar9->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  std::istream::seekg(peVar3,(piVar9->m_pos)._M_off,(piVar9->m_pos)._M_state);
  std::istream::read((char *)peVar3,(long)&local_30);
  *(uint *)(piVar9->m_id)._M_elems = (uint)local_30.pimpl;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  peVar3 = (piVar9->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var4 = (piVar9->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  std::istream::seekg(peVar3,(piVar9->m_pos)._M_off + 4,(piVar9->m_pos)._M_state);
  std::istream::read((char *)peVar3,(long)&local_30);
  piVar9->m_size = (uint)local_30.pimpl;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    local_30.pimpl._0_4_ = piVar9->m_size;
  }
  lVar11 = (ulong)(uint)local_30.pimpl + (piVar9->m_pos)._M_off;
  piVar2 = this->pimpl;
  if (lVar11 <= (piVar2->m_limit)._M_off) {
    _Var5 = (piVar9->m_pos)._M_state;
    (piVar9->m_limit)._M_off = lVar11;
    (piVar9->m_limit)._M_state = _Var5;
    psVar1 = &piVar2->m_pos;
    psVar1->_M_off = psVar1->_M_off + (ulong)((uint)local_30.pimpl + ((uint)local_30.pimpl & 1) + 8)
    ;
    local_30.pimpl = piVar9;
    ~Chunk(&local_30);
    return this;
  }
  puVar10 = (undefined4 *)__cxa_allocate_exception(0x10);
  *puVar10 = 2;
  *(char **)(puVar10 + 2) = "Chunk size outside of range";
  __cxa_throw(puVar10,&Error::typeinfo,0);
}

Assistant:

iter &iter::operator++() {
  auto im = new riffcpp::Chunk::impl();
  im->m_stream = pimpl->m_stream;
  im->m_pos = pimpl->m_pos;

  im->m_id = read_id(im->m_stream, im->m_pos);
  im->m_size = read_size(im->m_stream, im->m_pos);

  auto limit = im->m_pos + std::streamoff{im->m_size};

  if (limit > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
  im->m_limit = limit;

  riffcpp::Chunk chunk{im};
  std::uint32_t sz = chunk.size();
  std::streamoff offs{sz + sz % 2 + 8};

  pimpl->m_pos += offs;
  return *this;
}